

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p2sc_fits.c
# Opt level: O1

char * sfts_free(sfts_t *f)

{
  int *status;
  int iVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  char *pcVar5;
  sfts_t *f_00;
  undefined8 uVar6;
  undefined8 *puVar7;
  undefined8 uVar8;
  bool bVar9;
  sfkey_t k;
  char _msg [31];
  undefined1 local_88 [88];
  
  if (f == (sfts_t *)0x0) {
    return (char *)0x0;
  }
  status = &f->stat;
  if (f->name == (char *)0x0) {
    ffclos(f->fts,status);
    if (f->stat == 0) {
      return (char *)0x0;
    }
    if (f->name == (char *)0x0) {
      uVar8 = g_strdup("memory");
    }
    else {
      uVar8 = g_path_get_basename();
    }
    ffgerr(*status,_msg);
    iVar1 = 0x8f;
  }
  else {
    if (f->ptr != (void *)0x0) {
      ffpcks(f->fts,status);
      pcVar5 = p2sc_get_string("history");
      if (pcVar5 != (char *)0x0) {
        ffphis(f->fts,pcVar5,status);
      }
      iVar1 = commit_fits(f,0);
      while (iVar1 != 0) {
        f_00 = sfts_openro(f->name);
        k.v.f = 0.0;
        k.c = (char *)0x0;
        k.k = "DATASUM";
        k.t = 'S';
        k._9_7_ = 0;
        iVar1 = sfts_get_nhdus(f);
        iVar2 = sfts_get_nhdus(f_00);
        if (iVar1 == iVar2) {
          if (iVar1 < 1) {
LAB_001140c1:
            pcVar5 = sfts_free(f_00);
            g_free(pcVar5);
            sfts_goto_hdu(f,1);
            commit_fits(f,1);
            break;
          }
          iVar2 = 1;
          while( true ) {
            local_88[0] = 0;
            _msg._0_4_ = _msg._0_4_ & 0xffffff00;
            sfts_goto_hdu(f,iVar2);
            sfts_goto_hdu(f_00,iVar2);
            k.v.s = _msg;
            sfts_read_key(f,&k);
            k.v.s = local_88;
            sfts_read_key(f_00,&k);
            iVar3 = strcmp(_msg,local_88);
            if (iVar3 != 0) break;
            bVar9 = iVar2 == iVar1;
            iVar2 = iVar2 + 1;
            if (bVar9) goto LAB_001140c1;
          }
        }
        pcVar5 = sfts_free(f_00);
        g_free(pcVar5);
        sfts_goto_hdu(f,1);
        pcVar5 = f->name;
        _msg[0] = '\0';
        _msg[1] = '\0';
        _msg[2] = '\0';
        _msg[3] = '\0';
        uVar8 = g_path_get_dirname(pcVar5);
        uVar6 = g_path_get_basename(pcVar5);
        puVar7 = (undefined8 *)g_strsplit(uVar6,".",3);
        g_free(uVar6);
        uVar4 = g_strv_length(puVar7);
        if ((uVar4 < 2) || (iVar1 = __isoc99_sscanf(puVar7[1],"%03d",_msg), iVar1 != 1)) {
          _msg._0_4_ = _msg._0_4_ + 1;
          uVar6 = g_strdup_printf("%s.%03d",*puVar7);
          g_free(*puVar7);
          *puVar7 = uVar6;
        }
        else {
          if (_msg._0_4_ == 999) {
            _p2sc_msg("new_name",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Helioviewer-Project[P]fits2img/libsidc/libp2sc/p2sc_fits.c"
                      ,0x58,"$Id: p2sc_fits.c 5204 2015-04-30 19:12:42Z bogdan $",0x12c0,"i == 999")
            ;
            goto LAB_0011421b;
          }
          g_free(puVar7[1]);
          _msg._0_4_ = _msg._0_4_ + 1;
          uVar6 = g_strdup_printf("%03d");
          puVar7[1] = uVar6;
        }
        uVar6 = g_strjoinv(".",puVar7);
        g_strfreev(puVar7);
        pcVar5 = (char *)g_build_filename(uVar8,uVar6,0);
        g_free(uVar6);
        g_free(uVar8);
        g_free(f->name);
        f->name = pcVar5;
        iVar1 = commit_fits(f,0);
      }
    }
    ffclos(f->fts,status);
    if (f->stat == 0) {
      pcVar5 = (char *)g_strdup(f->name);
      g_free(f->ptr);
      g_free(f->name);
      f->name = (char *)0x0;
      f->size = 0;
      f->fts = (fitsfile *)0x0;
      f->ptr = (void *)0x0;
      *(undefined8 *)&f->stat = 0;
      g_free(f);
      return pcVar5;
    }
    if (f->name == (char *)0x0) {
      uVar8 = g_strdup("memory");
    }
    else {
      uVar8 = g_path_get_basename();
    }
    ffgerr(*status,_msg);
    iVar1 = 0xab;
  }
  _msg[0x1e] = '\0';
  _p2sc_msg("sfts_free",
            "/workspace/llm4binary/github/license_all_cmakelists_25/Helioviewer-Project[P]fits2img/libsidc/libp2sc/p2sc_fits.c"
            ,iVar1,"$Id: p2sc_fits.c 5204 2015-04-30 19:12:42Z bogdan $",0x11f8,"FITS: %s: %s",_msg,
            uVar8);
LAB_0011421b:
  exit(1);
}

Assistant:

char *sfts_free(sfts_t *f) {
    char *ret = NULL;

    if (f) {
        int *s = &f->stat;

        /* temporary file in memory */
        if (!f->name) {
            fits_close_file(f->fts, s);
            CHK_FTS(f);
            return NULL;
        }

        /* commit memory file to disk */
        if (f->ptr) {
            /* write history & chksum */
            fits_write_chksum(f->fts, s);
            const char *h = p2sc_get_string("history");
            if (h)
                fits_write_history(f->fts, h, s);

          restart:
            if (commit_fits(f, 0)) {
                /* identical data, will replace */
                if (!compare_fits(f))
                    commit_fits(f, 1);
                else {
                    char *name = new_name(f->name);

                    g_free(f->name);
                    f->name = name;
                    goto restart;
                }
            }
        }

        fits_close_file(f->fts, s);
        CHK_FTS(f);

        ret = g_strdup(f->name);

        g_free(f->ptr);
        g_free(f->name);
        memset(f, 0, sizeof *f);
        g_free(f);
    }

    return ret;
}